

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.cpp
# Opt level: O1

void __thiscall
TPZEquationFilter::ScatterInternal<double>
          (TPZEquationFilter *this,TPZFMatrix<double> *vsmall,TPZFMatrix<double> *vexpand)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int64_t iVar5;
  double extraout_XMM0_Qa;
  
  iVar5 = this->fNumEq;
  if (this->fIsActive != false) {
    iVar5 = (this->fActiveEqs).fNElements;
  }
  if ((((vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow == iVar5) &&
      ((vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow == this->fNumEq)) &&
     ((vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <=
      (vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    if (this->fIsActive == false) {
      TPZFMatrix<double>::operator=(vexpand,vsmall);
      return;
    }
    (*(vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (vexpand);
    lVar1 = (vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (0 < lVar1) {
      lVar4 = 0;
      do {
        if (0 < iVar5) {
          lVar3 = 0;
          do {
            (*(vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(vsmall,lVar3,lVar4);
            lVar2 = (this->fActiveEqs).fStore[lVar3];
            if (((lVar2 < 0) ||
                ((vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2)) ||
               ((vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar4)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            vexpand->fElem
            [(vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar4 + lVar2] =
                 extraout_XMM0_Qa;
            lVar3 = lVar3 + 1;
          } while (iVar5 != lVar3);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != lVar1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &) const [TVar = double]"
             ,0x6b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Incompatible dimensions\nAborting...\n",0x2c);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZEquationFilter.cpp"
             ,0x4a);
}

Assistant:

void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &vsmall,
                     TPZFMatrix<TVar> &vexpand) const {
  int64_t neqcondense = this->NActiveEquations();
  if (vsmall.Rows() != neqcondense || vexpand.Rows() != fNumEq ||
      vsmall.Cols() > vexpand.Cols()) {
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Incompatible dimensions\nAborting...\n";
    DebugStop();
  }
  if (!IsActive()) {
    vexpand = vsmall;
    return;
  }
  vexpand.Zero();

#ifdef PZDEBUG
  {
    for (int64_t i = 0; i < neqcondense; i++) {
      if (fActiveEqs[i] >= fNumEq) {
        DebugStop();
      }
    }
  }
#endif
  const auto ncols = vsmall.Cols();
  for(auto j = 0; j < ncols; j++)
    for (int64_t i = 0; i < neqcondense; i++)
      vexpand(fActiveEqs[i], j) = vsmall.GetVal(i, j);
}